

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldOptions::MergeFrom(FieldOptions *this,FieldOptions *from)

{
  uint uVar1;
  LogMessage *other;
  InternalMetadataWithArena *this_00;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  FieldOptions *local_78;
  FieldOptions *from_local;
  FieldOptions *this_local;
  InternalMetadataWithArena *local_60;
  InternalMetadataWithArena *local_58;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x2aa5);
    local_b1 = 1;
    other = internal::LogMessage::operator<<(&local_b0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b0);
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_78->_extensions_);
  this_00 = &this->_internal_metadata_;
  this_local = (FieldOptions *)&local_78->_internal_metadata_;
  local_60 = this_00;
  local_58 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_00,&local_28->unknown_fields);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&this->uninterpreted_option_,&local_78->uninterpreted_option_);
  uVar1 = (local_78->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      this->ctype_ = local_78->ctype_;
    }
    if ((uVar1 & 2) != 0) {
      this->packed_ = (bool)(local_78->packed_ & 1);
    }
    if ((uVar1 & 4) != 0) {
      this->lazy_ = (bool)(local_78->lazy_ & 1);
    }
    if ((uVar1 & 8) != 0) {
      this->deprecated_ = (bool)(local_78->deprecated_ & 1);
    }
    if ((uVar1 & 0x10) != 0) {
      this->weak_ = (bool)(local_78->weak_ & 1);
    }
    if ((uVar1 & 0x20) != 0) {
      this->jstype_ = local_78->jstype_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void FieldOptions::MergeFrom(const FieldOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 63u) {
    if (cached_has_bits & 0x00000001u) {
      ctype_ = from.ctype_;
    }
    if (cached_has_bits & 0x00000002u) {
      packed_ = from.packed_;
    }
    if (cached_has_bits & 0x00000004u) {
      lazy_ = from.lazy_;
    }
    if (cached_has_bits & 0x00000008u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00000010u) {
      weak_ = from.weak_;
    }
    if (cached_has_bits & 0x00000020u) {
      jstype_ = from.jstype_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}